

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O1

Aig_ManCut_t * Aig_ComputeCuts(Aig_Man_t *pAig,int nCutsMax,int nLeafMax,int fTruth,int fVerbose)

{
  Aig_Obj_t *pObj;
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_ManCut_t *p;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int level;
  long lVar6;
  timespec ts;
  int nCutsK;
  timespec local_48;
  uint local_34;
  
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (pAig->pManCuts == (void *)0x0) {
    p = Aig_ManCutStart(pAig,nCutsMax,nLeafMax,fTruth,fVerbose);
    pVVar4 = pAig->vCis;
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        Aig_ObjPrepareCuts(p,(Aig_Obj_t *)pVVar4->pArray[lVar6],1);
        lVar6 = lVar6 + 1;
        pVVar4 = pAig->vCis;
      } while (lVar6 < pVVar4->nSize);
    }
    pVVar4 = pAig->vObjs;
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        pObj = (Aig_Obj_t *)pVVar4->pArray[lVar6];
        if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
          Aig_ObjComputeCuts(p,pObj,1);
        }
        lVar6 = lVar6 + 1;
        pVVar4 = pAig->vObjs;
      } while (lVar6 < pVVar4->nSize);
    }
    if (fVerbose != 0) {
      uVar2 = Aig_ManCutCount(p,(int *)&local_34);
      printf("Nodes = %6d. Total cuts = %6d. %d-input cuts = %6d.\n",
             (ulong)(uint)(pVVar4->nSize - pAig->nDeleted),(ulong)uVar2,(ulong)(uint)nLeafMax,
             (ulong)local_34);
      uVar2 = p->nCutSize;
      iVar1 = p->nTruthWords;
      iVar3 = Aig_MmFixedReadMemUsage(p->pMemCuts);
      level = 0x9e88f7;
      printf("Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
             (double)iVar3 * 9.5367431640625e-07,(ulong)uVar2,(ulong)(uint)(iVar1 << 2));
      Abc_Print(level,"%s =","Runtime");
      iVar3 = 3;
      iVar1 = clock_gettime(3,&local_48);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
    }
    pAig->pManCuts = p;
    return p;
  }
  __assert_fail("pAig->pManCuts == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                ,0x27d,"Aig_ManCut_t *Aig_ComputeCuts(Aig_Man_t *, int, int, int, int)");
}

Assistant:

Aig_ManCut_t * Aig_ComputeCuts( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fTruth, int fVerbose )
{
    Aig_ManCut_t * p;
    Aig_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    assert( pAig->pManCuts == NULL );
    // start the manager
    p = Aig_ManCutStart( pAig, nCutsMax, nLeafMax, fTruth, fVerbose );
    // set elementary cuts at the PIs
    Aig_ManForEachCi( pAig, pObj, i )
        Aig_ObjPrepareCuts( p, pObj, 1 );
    // process the nodes
    Aig_ManForEachNode( pAig, pObj, i )
        Aig_ObjComputeCuts( p, pObj, 1 );
    // print stats
    if ( fVerbose )
    {
        int nCuts, nCutsK;
        nCuts = Aig_ManCutCount( p, &nCutsK );
        printf( "Nodes = %6d. Total cuts = %6d. %d-input cuts = %6d.\n",
            Aig_ManObjNum(pAig), nCuts, nLeafMax, nCutsK );
        printf( "Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
            p->nCutSize, 4*p->nTruthWords, 1.0*Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
/*
        Aig_ManForEachNode( pAig, pObj, i )
            if ( i % 300 == 0 )
                Aig_ObjCutPrint( p, pObj );
*/
    }
    // remember the cut manager
    pAig->pManCuts = p;
    return p;
}